

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualMemory.c
# Opt level: O2

void * sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping
                 (size_t sizeToAllocate,void **writeableMapping,void **executableMapping)

{
  uint __fd;
  int iVar1;
  void *pvVar2;
  char *__s;
  
  *writeableMapping = (void *)0x0;
  *executableMapping = (void *)0x0;
  __fd = memfd_create("sysbvm_code",1);
  if ((int)__fd < 0) {
    __s = "failed to make memfd.";
  }
  else {
    iVar1 = ftruncate(__fd,sizeToAllocate);
    if (iVar1 < 0) {
      __s = "failed to allocate memory with dual mapping for JIT execution.";
    }
    else {
      pvVar2 = mmap((void *)0x0,sizeToAllocate,3,1,__fd,0);
      if (pvVar2 != (void *)0xffffffffffffffff) {
        *writeableMapping = pvVar2;
        pvVar2 = mmap((void *)0x0,sizeToAllocate,5,1,__fd,0);
        if (pvVar2 != (void *)0xffffffffffffffff) {
          *executableMapping = pvVar2;
          return (void *)(ulong)__fd;
        }
      }
      __s = "failed to map read-write memory for JIT execution.";
    }
  }
  perror(__s);
  abort();
}

Assistant:

void *sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping(size_t sizeToAllocate, void **writeableMapping, void **executableMapping)
{
    *writeableMapping = NULL;
    *executableMapping = NULL;

    int fd = memfd_create("sysbvm_code", MFD_CLOEXEC);
    if(fd < 0)
    {
        perror("failed to make memfd.");
        abort();
    }

    if(ftruncate(fd, sizeToAllocate) < 0)
    {
        perror("failed to allocate memory with dual mapping for JIT execution.");
        abort();
    }

    // Read-Write mapping.
    void *mmapResult = mmap(0, sizeToAllocate, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    if(mmapResult == MAP_FAILED)
    {
        perror("failed to map read-write memory for JIT execution.");
        abort();
    }
    *writeableMapping = mmapResult;

    // Read-Execute mapping.
    mmapResult = mmap(0, sizeToAllocate, PROT_READ | PROT_EXEC, MAP_SHARED, fd, 0);
    if(mmapResult == MAP_FAILED)
    {
        perror("failed to map read-write memory for JIT execution.");
        abort();
    }
    *executableMapping = mmapResult;

    return (void*)(intptr_t)fd;
}